

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi.h
# Opt level: O1

float * stbi_loadf_from_callbacks
                  (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *comp,int req_comp)

{
  float *pfVar1;
  stbi__context s;
  stbi__context local_100;
  
  stbi__start_callbacks(&local_100,clbk,user);
  pfVar1 = stbi__loadf_main(&local_100,x,y,comp,req_comp);
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}